

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlookup.cpp
# Opt level: O1

int __thiscall
Vlookup::VertexPool<Vlookup::VertexPosition>::getVertex
          (VertexPool<Vlookup::VertexPosition> *this,VertexPosition *vtx)

{
  pointer *ppVVar1;
  iterator __position;
  iterator iVar2;
  int idx;
  _Rb_tree_color local_20 [2];
  
  DAT_00b98058 = vtx->mPos[2];
  VertexLess::mFind = *(undefined8 *)vtx->mPos;
  local_20[1] = 0xffffffff;
  VertexLess::mList = &this->mVtxs;
  iVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_Vlookup::VertexLess,_std::allocator<int>_>::
          find((_Rb_tree<int,_int,_std::_Identity<int>,_Vlookup::VertexLess,_std::allocator<int>_> *
               )this,(key_type_conflict1 *)(local_20 + 1));
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mVertSet)._M_t._M_impl.super__Rb_tree_header) {
    __position._M_current =
         (this->mVtxs).
         super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_20[0] = (int)((ulong)((long)__position._M_current -
                               (long)(this->mVtxs).
                                     super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    if (__position._M_current ==
        (this->mVtxs).
        super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Vlookup::VertexPosition,std::allocator<Vlookup::VertexPosition>>::
      _M_realloc_insert<Vlookup::VertexPosition_const&>
                ((vector<Vlookup::VertexPosition,std::allocator<Vlookup::VertexPosition>> *)
                 &this->mVtxs,__position,vtx);
    }
    else {
      (__position._M_current)->mPos[2] = vtx->mPos[2];
      *(undefined8 *)(__position._M_current)->mPos = *(undefined8 *)vtx->mPos;
      ppVVar1 = &(this->mVtxs).
                 super__Vector_base<Vlookup::VertexPosition,_std::allocator<Vlookup::VertexPosition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
    std::_Rb_tree<int,int,std::_Identity<int>,Vlookup::VertexLess,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,Vlookup::VertexLess,std::allocator<int>> *)this
               ,(int *)local_20);
  }
  else {
    local_20[0] = iVar2._M_node[1]._M_color;
  }
  return local_20[0];
}

Assistant:

int getVertex(const Type& vtx)
	{
		VertexLess::SetSearch(vtx,&mVtxs);
		VertexSet::iterator found;
		found = mVertSet.find( -1 );
		if ( found != mVertSet.end() )
		{
			return *found;
		}
		int idx = (int)mVtxs.size();
		mVtxs.push_back( vtx );
		mVertSet.insert( idx );
		return idx;
	}